

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O2

void Unit_exponent(int val)

{
  double dVar1;
  unit *puVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  puVar2 = usp;
  if (UnitsOn == '\x01') {
    if (usp < unit_stack) {
      __assert_fail("usp >= unit_stack",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/units.c"
                    ,0x149,"void Unit_exponent()");
    }
    for (lVar4 = 8; lVar4 != 0x12; lVar4 = lVar4 + 1) {
      puVar2->dim[lVar4 + -8] = puVar2->dim[lVar4 + -8] * (char)val;
    }
    dVar1 = puVar2->factor;
    dVar5 = dVar1;
    for (iVar3 = 1; iVar3 < val; iVar3 = iVar3 + 1) {
      dVar5 = dVar5 * dVar1;
      puVar2->factor = dVar5;
    }
  }
  return;
}

Assistant:

void Unit_exponent(val)
	int val;
{
	/* multiply top of stack by val and leave on stack */
	int i;
	double d;
	
	IFUNITS
	assert(usp >= unit_stack);
	for (i=0; i<NDIM; i++) {
		usp->dim[i] *= val;
	}
	d = usp->factor;
	for (i=1; i<val; i++) {
		usp->factor *= d;
	}
}